

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

void Pdr_SetPrint(FILE *pFile,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *__s;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  __s = (char *)malloc((long)(nRegs + 1));
  uVar4 = 0;
  uVar5 = (ulong)(uint)nRegs;
  if (nRegs < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    __s[uVar4] = '-';
  }
  __s[uVar5] = '\0';
  for (lVar6 = 0; lVar6 < p->nLits; lVar6 = lVar6 + 1) {
    if (*(int *)(&p->field_0x14 + lVar6 * 4) != -1) {
      iVar1 = Abc_LitIsCompl(*(int *)(&p->field_0x14 + lVar6 * 4));
      uVar2 = Abc_Lit2Var(*(int *)(&p->field_0x14 + lVar6 * 4));
      __s[uVar2] = iVar1 == 0 | 0x30;
    }
  }
  if (vFlopCounts != (Vec_Int_t *)0x0) {
    iVar1 = 0;
    for (lVar6 = 0; lVar6 < vFlopCounts->nSize; lVar6 = lVar6 + 1) {
      iVar3 = Vec_IntEntry(vFlopCounts,(int)lVar6);
      if (iVar3 != 0) {
        __s[iVar1] = __s[lVar6];
        iVar1 = iVar1 + 1;
      }
    }
    __s[iVar1] = '\0';
  }
  fputs(__s,(FILE *)pFile);
  free(__s);
  return;
}

Assistant:

void Pdr_SetPrint( FILE * pFile, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[Abc_Lit2Var(p->Lits[i])] = (Abc_LitIsCompl(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        k = 0;
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    fprintf( pFile, "%s", pBuff );
    ABC_FREE( pBuff );
}